

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatted_exporters.cpp
# Opt level: O2

void traverse_ext_json(string *curr_json,size_t curr_node,ExtIsoForest *model,
                      vector<IsoHPlane,_std::allocator<IsoHPlane>_> *nodes,
                      size_t *terminal_node_mappings,
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *numeric_colnames,
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *categ_colnames,
                      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *categ_levels,bool output_tree_num,bool index1,size_t tree_num)

{
  int iVar1;
  long lVar2;
  unsigned_long __val;
  size_t *terminal_node_mappings_00;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *nodes_00;
  runtime_error *this;
  long lVar3;
  pointer pIVar4;
  ulong uVar5;
  long lVar6;
  double __val_00;
  bool index1_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  ExtIsoForest *local_180;
  allocator<char> local_174;
  allocator<char> local_173;
  allocator<char> local_172;
  allocator<char> local_171;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  long local_110;
  string local_108;
  size_t *local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e0;
  long local_d8;
  ulong local_d0;
  string *local_c8;
  string local_c0;
  ulong local_a0;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (!interrupt_switch) {
    pIVar4 = (nodes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
             super__Vector_impl_data._M_start + curr_node;
    local_180 = model;
    local_e8 = terminal_node_mappings;
    local_e0 = numeric_colnames;
    local_98 = nodes;
    if (curr_node != 0) {
      std::__cxx11::string::append((char *)curr_json);
    }
    uVar5 = (ulong)index1;
    std::__cxx11::to_string(&local_150,uVar5 + curr_node);
    std::operator+(&local_170,"\"",&local_150);
    std::operator+(&local_1a0,&local_170,"\": {\"terminal\":\"");
    std::__cxx11::string::append((string *)curr_json);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_150);
    if (pIVar4->hplane_left == 0) {
      if ((local_180->scoring_metric == Density) || (local_180->scoring_metric == BoxedRatio)) {
        __val_00 = -pIVar4->score;
      }
      else {
        __val_00 = pIVar4->score;
      }
      __val = local_e8[curr_node];
      std::__cxx11::to_string(&local_108,__val_00);
      std::operator+(&local_130,"yes\", \"score\":",&local_108);
      std::operator+(&local_150,&local_130,", \"leaf\":");
      std::__cxx11::to_string(&local_c0,__val);
      std::operator+(&local_170,&local_150,&local_c0);
      std::operator+(&local_1a0,&local_170,"}");
      std::__cxx11::string::append((string *)curr_json);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_108);
    }
    else {
      std::__cxx11::to_string(&local_108,pIVar4->hplane_left + uVar5);
      std::operator+(&local_130,"no\", \"node_when_condition_is_met\":",&local_108);
      std::operator+(&local_150,&local_130,", \"node_when_condition_is_not_met\":");
      std::__cxx11::to_string(&local_c0,pIVar4->hplane_right + uVar5);
      std::operator+(&local_170,&local_150,&local_c0);
      std::operator+(&local_1a0,&local_170,", \"combination\":[");
      local_a0 = uVar5;
      std::__cxx11::string::append((string *)curr_json);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_108);
      local_d8 = 0;
      uVar5 = 0;
      lVar3 = 0;
      local_c8 = curr_json;
      while( true ) {
        if ((ulong)((long)*(pointer *)
                           ((long)&(pIVar4->col_num).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl + 8) -
                    *(long *)&(pIVar4->col_num).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl >> 3) <= uVar5) break;
        local_110 = lVar3;
        if (uVar5 != 0) {
          std::__cxx11::string::append((char *)curr_json);
        }
        std::__cxx11::string::append((char *)curr_json);
        iVar1 = *(int *)(*(long *)&(pIVar4->col_type).
                                   super__Vector_base<ColType,_std::allocator<ColType>_>._M_impl.
                                   super__Vector_impl_data + uVar5 * 4);
        if (iVar1 == 0x20) {
          local_d0 = uVar5;
          std::operator+(&local_170,"\"column\":\"",
                         (categ_colnames->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start +
                         *(long *)(*(long *)&(pIVar4->col_num).
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl + uVar5 * 8));
          std::operator+(&local_1a0,&local_170,"\", \"column_type\":\"categorical\", ");
          std::__cxx11::string::append((string *)curr_json);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::__cxx11::string::~string((string *)&local_170);
          lVar3 = local_110;
          if (local_180->cat_split_type == SubSet) {
            std::__cxx11::string::append((char *)curr_json);
            lVar6 = local_110 * 0x18;
            lVar3 = 0;
            for (uVar5 = 0; curr_json = local_c8,
                lVar2 = *(long *)&(pIVar4->cat_coef).
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data,
                uVar5 < (ulong)(*(long *)(lVar2 + 8 + lVar6) - *(long *)(lVar2 + lVar6) >> 3);
                uVar5 = uVar5 + 1) {
              if (uVar5 != 0) {
                std::__cxx11::string::append((char *)local_c8);
              }
              std::operator+(&local_150,"\"",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (*(long *)&(categ_levels->
                                        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start
                                        [*(long *)(*(long *)&(pIVar4->col_num).
                                                                                                                          
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl + local_d0 * 8)].
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data + lVar3));
              std::operator+(&local_170,&local_150,"\":");
              std::__cxx11::to_string
                        (&local_130,
                         *(double *)
                          (*(long *)(*(long *)&(pIVar4->cat_coef).
                                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                               ._M_impl.super__Vector_impl_data + lVar6) + uVar5 * 8
                          ));
              std::operator+(&local_1a0,&local_170,&local_130);
              std::__cxx11::string::append((string *)local_c8);
              std::__cxx11::string::~string((string *)&local_1a0);
              std::__cxx11::string::~string((string *)&local_130);
              std::__cxx11::string::~string((string *)&local_170);
              std::__cxx11::string::~string((string *)&local_150);
              lVar3 = lVar3 + 0x20;
            }
            std::__cxx11::string::append((char *)local_c8);
          }
          else if (local_180->cat_split_type == SingleCateg) {
            std::operator+(&local_130,"\"category\":\"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)*(int *)(*(long *)&(pIVar4->chosen_cat).
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data + local_110 * 4
                                          ) * 0x20 +
                           *(long *)&(categ_levels->
                                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start
                                     [*(long *)(*(long *)&(pIVar4->col_num).
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl + local_d0 * 8)].
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data));
            std::operator+(&local_150,&local_130,"\", \"coefficient_category\":");
            std::__cxx11::to_string
                      (&local_108,
                       *(double *)
                        (*(long *)&(pIVar4->fill_new).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data + lVar3 * 8));
            std::operator+(&local_170,&local_150,&local_108);
            std::operator+(&local_1a0,&local_170,", \"coefficient_other_categories\":0.0");
            std::__cxx11::string::append((string *)curr_json);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::__cxx11::string::~string((string *)&local_170);
            std::__cxx11::string::~string((string *)&local_108);
            std::__cxx11::string::~string((string *)&local_150);
            std::__cxx11::string::~string((string *)&local_130);
          }
          uVar5 = local_d0;
          if (local_180->missing_action != Fail) {
            std::__cxx11::to_string
                      (&local_170,
                       *(double *)
                        (*(long *)&(pIVar4->fill_val).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data + local_d0 * 8));
            std::operator+(&local_1a0,", \"imputation_value\":",&local_170);
            std::__cxx11::string::append((string *)curr_json);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::__cxx11::string::~string((string *)&local_170);
          }
          local_110 = local_110 + 1;
        }
        else {
          if (iVar1 != 0x1f) {
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_108,"Unexpected error in ",&local_171);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/david-cortes[P]isotree/src/formatted_exporters.cpp"
                       ,&local_172);
            std::operator+(&local_130,&local_108,&local_c0);
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,":",&local_173);
            std::operator+(&local_150,&local_130,&local_90);
            std::__cxx11::to_string(&local_50,0x497);
            std::operator+(&local_170,&local_150,&local_50);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_70,
                       ". Please open an issue in GitHub with this information, indicating the installed version of \'isotree\'.\n"
                       ,&local_174);
            std::operator+(&local_1a0,&local_170,&local_70);
            std::runtime_error::runtime_error(this,(string *)&local_1a0);
            __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::operator+(&local_108,"\"column\":\"",
                         (local_e0->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start +
                         *(long *)(*(long *)&(pIVar4->col_num).
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl + uVar5 * 8));
          std::operator+(&local_130,&local_108,"\", \"column_type\":\"numeric\", \"coefficient\":");
          std::__cxx11::to_string
                    (&local_c0,
                     *(double *)
                      (*(long *)&(pIVar4->coef).super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data + local_d8 * 8));
          std::operator+(&local_150,&local_130,&local_c0);
          std::operator+(&local_170,&local_150,", \"centering\":");
          std::__cxx11::to_string
                    (&local_90,
                     *(double *)
                      (*(long *)&(pIVar4->mean).super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data + local_d8 * 8));
          std::operator+(&local_1a0,&local_170,&local_90);
          std::__cxx11::string::append((string *)curr_json);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::~string((string *)&local_c0);
          std::__cxx11::string::~string((string *)&local_130);
          std::__cxx11::string::~string((string *)&local_108);
          if (local_180->missing_action != Fail) {
            std::__cxx11::to_string
                      (&local_170,
                       *(double *)
                        (*(long *)&(pIVar4->fill_val).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data + uVar5 * 8));
            std::operator+(&local_1a0,", \"imputation_value\":",&local_170);
            std::__cxx11::string::append((string *)curr_json);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::__cxx11::string::~string((string *)&local_170);
          }
          local_d8 = local_d8 + 1;
        }
        std::__cxx11::string::append((char *)curr_json);
        uVar5 = uVar5 + 1;
        lVar3 = local_110;
      }
      std::__cxx11::to_string(&local_170,pIVar4->split_point);
      std::operator+(&local_1a0,"], \"condition\":\"<=\", \"value\":",&local_170);
      std::__cxx11::string::append((string *)curr_json);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_170);
      if (local_180->has_range_penalty == true) {
        std::__cxx11::to_string(&local_130,pIVar4->range_low);
        std::operator+(&local_150,", \"range_low\":",&local_130);
        std::operator+(&local_170,&local_150,", \"range_high\":");
        std::__cxx11::to_string(&local_108,pIVar4->range_high);
        std::operator+(&local_1a0,&local_170,&local_108);
        std::__cxx11::string::append((string *)curr_json);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_130);
      }
      std::__cxx11::string::append((char *)curr_json);
      nodes_00 = local_98;
      terminal_node_mappings_00 = local_e8;
      index1_00 = SUB81(local_a0,0);
      traverse_ext_json(curr_json,pIVar4->hplane_left,local_180,local_98,local_e8,local_e0,
                        categ_colnames,categ_levels,output_tree_num,index1_00,tree_num);
      traverse_ext_json(curr_json,pIVar4->hplane_right,local_180,nodes_00,terminal_node_mappings_00,
                        local_e0,categ_colnames,categ_levels,output_tree_num,index1_00,tree_num);
    }
  }
  return;
}

Assistant:

void traverse_ext_json
(
    std::string &curr_json, size_t curr_node,
    const ExtIsoForest &model, const std::vector<IsoHPlane> &nodes,
    const size_t *restrict terminal_node_mappings,
    const std::vector<std::string> &numeric_colnames,
    const std::vector<std::string> &categ_colnames,
    const std::vector<std::vector<std::string>> &categ_levels,
    bool output_tree_num, bool index1, size_t tree_num
)
{
    if (interrupt_switch) return;
    const IsoHPlane *hplane = &nodes[curr_node];
    if (curr_node > 0) curr_json.append(",");

    curr_json.append(
        "\"" +
        std::to_string(curr_node + (size_t)index1) +
        "\": {\"terminal\":\""
    );

    /* terminal node */
    if (hplane->hplane_left == 0)
    {
        const double score_write = (model.scoring_metric != Density && model.scoring_metric != BoxedRatio)?
                                    hplane->score : -hplane->score;
        const size_t terminal_idx = terminal_node_mappings[curr_node];
        curr_json.append(
            "yes\", \"score\":" +
            std::to_string(score_write) +
            ", \"leaf\":" +
            std::to_string(terminal_idx) +
            "}"
        );
        return;
    }

    curr_json.append(
        "no\", \"node_when_condition_is_met\":" +
        std::to_string(hplane->hplane_left + (size_t)index1) +
        ", \"node_when_condition_is_not_met\":" +
        std::to_string(hplane->hplane_right + (size_t)index1) +
        ", \"combination\":["
    );

    size_t n_visited_numeric = 0;
    size_t n_visited_categ = 0;
    for (size_t ix = 0; ix < hplane->col_num.size(); ix++)
    {
        if (ix > 0) curr_json.append(", ");
        curr_json.append("{");
        switch (hplane->col_type[ix])
        {
            case Numeric:
            {
                curr_json.append(
                    "\"column\":\"" +
                    numeric_colnames[hplane->col_num[ix]] +
                    "\", \"column_type\":\"numeric\", \"coefficient\":" +
                    std::to_string(hplane->coef[n_visited_numeric]) +
                    ", \"centering\":" +
                    std::to_string(hplane->mean[n_visited_numeric])
                );
                if (model.missing_action != Fail)
                {
                    curr_json.append(
                        ", \"imputation_value\":" +
                        std::to_string(hplane->fill_val[ix])
                    );
                }
                n_visited_numeric++;
                break;
            }

            case Categorical:
            {
                curr_json.append(
                    "\"column\":\"" +
                    categ_colnames[hplane->col_num[ix]] +
                    "\", \"column_type\":\"categorical\", "
                );
                switch (model.cat_split_type)
                {
                    case SingleCateg:
                    {
                        curr_json.append(
                            "\"category\":\"" +
                            categ_levels[hplane->col_num[ix]][hplane->chosen_cat[n_visited_categ]] +
                            "\", \"coefficient_category\":" +
                            std::to_string(hplane->fill_new[n_visited_categ]) +
                            ", \"coefficient_other_categories\":0.0"
                        );
                        break;
                    }

                    case SubSet:
                    {
                        curr_json.append(
                            "\"coefficients\":{"
                        );
                        for (size_t categ = 0; categ < hplane->cat_coef[n_visited_categ].size(); categ++)
                        {
                            if (categ > 0) curr_json.append(", ");
                            curr_json.append(
                                "\"" +
                                categ_levels[hplane->col_num[ix]][categ] +
                                "\":" +
                                std::to_string(hplane->cat_coef[n_visited_categ][categ])
                            );
                        }
                        curr_json.append("}");
                        break;
                    }
                }
                if (model.missing_action != Fail)
                {
                    curr_json.append(
                        ", \"imputation_value\":" +
                        std::to_string(hplane->fill_val[ix])
                    );
                }
                n_visited_categ++;
                break;
            }

            default:
            {
                unexpected_error();
                break;
            }
        }
        curr_json.append("}");
    }

    curr_json.append(
        "], \"condition\":\"<=\", \"value\":" +
        std::to_string(hplane->split_point)
    );

    if (model.has_range_penalty)
    {
        curr_json.append(
            ", \"range_low\":" +
            std::to_string(hplane->range_low) +
            ", \"range_high\":" +
            std::to_string(hplane->range_high)
        );
    }

    curr_json.append("}");

    traverse_ext_json(
        curr_json,
        hplane->hplane_left,
        model, nodes,
        terminal_node_mappings,
        numeric_colnames,
        categ_colnames,
        categ_levels,
        output_tree_num, index1, tree_num
    );

    traverse_ext_json(
        curr_json,
        hplane->hplane_right,
        model, nodes,
        terminal_node_mappings,
        numeric_colnames,
        categ_colnames,
        categ_levels,
        output_tree_num, index1, tree_num
    );
}